

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgga_x_mn12.c
# Opt level: O0

void func_exc_pol(xc_func_type *p,size_t ip,double *rho,double *sigma,double *lapl,double *tau,
                 xc_mgga_out_params *out)

{
  double *pdVar1;
  bool bVar2;
  double *in_RCX;
  long lVar3;
  double *in_RDX;
  long in_RSI;
  long *in_RDI;
  double *in_R9;
  double dVar4;
  double __x;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  long *in_stack_00000008;
  hyb_mgga_xc_gas22_params *params;
  double tzk0;
  double t542;
  double t541;
  double t538;
  double t537;
  double t536;
  double t535;
  double t532;
  double t531;
  double t530;
  double t529;
  double t528;
  double t527;
  double t526;
  double t525;
  double t524;
  double t523;
  double t521;
  double t519;
  double t518;
  double t517;
  double t516;
  double t515;
  double t513;
  double t512;
  double t511;
  double t510;
  double t509;
  double t508;
  double t507;
  double t505;
  double t502;
  double t500;
  double t496;
  double t495;
  double t493;
  double t492;
  double t491;
  double t488;
  double t483;
  double t479;
  double t478;
  double t475;
  double t470;
  double t468;
  double t467;
  double t466;
  double t465;
  double t464;
  double t463;
  double t462;
  double t461;
  double t460;
  double t459;
  double t458;
  double t457;
  double t456;
  double t454;
  double t453;
  double t450;
  double t448;
  double t445;
  double t442;
  double t441;
  double t439;
  double t437;
  double t436;
  double t431;
  double t430;
  double t429;
  double t428;
  double t427;
  double t424;
  double t423;
  double t421;
  double t420;
  double t419;
  double t418;
  double t417;
  double t416;
  double t415;
  double t414;
  double t413;
  double t412;
  double t410;
  double t409;
  double t408;
  double t407;
  double t405;
  double t401;
  double t400;
  double t398;
  double t397;
  double t394;
  double t388;
  double t387;
  double t386;
  double t383;
  double t378;
  double t374;
  double t373;
  double t370;
  double t365;
  double t363;
  double t361;
  double t360;
  double t357;
  double t355;
  double t353;
  double t351;
  double t348;
  double t347;
  double t345;
  double t343;
  double t341;
  double t340;
  double t339;
  double t338;
  double t333;
  double t332;
  double t331;
  double t330;
  double t329;
  double t328;
  double t325;
  double t324;
  double t322;
  double t321;
  double t320;
  double t319;
  double t318;
  double t317;
  double t316;
  double t315;
  double t314;
  double t313;
  double t312;
  double t310;
  double t309;
  double t308;
  double t307;
  double t306;
  double t304;
  double t303;
  double t299;
  double t298;
  double t296;
  double t295;
  double t294;
  double t291;
  double t285;
  double t284;
  double t283;
  double t280;
  double t275;
  double t271;
  double t270;
  double t267;
  double t262;
  double t260;
  double t259;
  double t255;
  double t253;
  double t251;
  double t250;
  double t247;
  double t245;
  double t243;
  double t242;
  double t241;
  double t240;
  double t239;
  double t238;
  double t237;
  double t236;
  double t234;
  double t231;
  double t230;
  double t228;
  double t226;
  double t224;
  double t223;
  double t222;
  double t221;
  double t220;
  double t219;
  double t216;
  double t215;
  double t214;
  double t212;
  double t211;
  double t210;
  double t209;
  double t208;
  double t207;
  double t202;
  double t201;
  double t199;
  double t198;
  double t196;
  double t195;
  double t194;
  double t193;
  double t192;
  double t191;
  double t187;
  double t184;
  double t181;
  double t180;
  double t178;
  double t177;
  double t175;
  double t173;
  double t172;
  double t169;
  double t168;
  double t166;
  double t163;
  double t160;
  double t157;
  double t156;
  double t154;
  double t153;
  double t151;
  double t150;
  double t147;
  double t146;
  double t145;
  double t144;
  double t143;
  double t140;
  double t139;
  double t138;
  double t137;
  double t136;
  double t134;
  double t133;
  double t132;
  double t130;
  double t127;
  double t126;
  double t125;
  double t123;
  double t122;
  double t121;
  double t120;
  double t119;
  double t118;
  double t116;
  double t115;
  double t114;
  double t113;
  double t112;
  double t111;
  double t110;
  double t109;
  double t105;
  double t104;
  double t102;
  double t101;
  double t99;
  double t98;
  double t97;
  double t96;
  double t95;
  double t94;
  double t93;
  double t92;
  double t88;
  double t85;
  double t82;
  double t81;
  double t79;
  double t78;
  double t76;
  double t74;
  double t73;
  double t72;
  double t69;
  double t68;
  double t66;
  double t63;
  double t60;
  double t57;
  double t56;
  double t54;
  double t53;
  double t51;
  double t50;
  double t47;
  double t46;
  double t45;
  double t44;
  double t43;
  double t40;
  double t39;
  double t38;
  double t37;
  double t36;
  double t35;
  double t34;
  double t33;
  double t32;
  double t31;
  double t30;
  double t29;
  double t28;
  double t27;
  double t26;
  double t25;
  double t24;
  double t22;
  double t21;
  double t20;
  double t19;
  double t18;
  double t17;
  double t16;
  double t15;
  double t14;
  double t13;
  double t12;
  double t10;
  double t9;
  double t8;
  double t7;
  double t6;
  double t5;
  double t4;
  double t3;
  double local_b48;
  double local_b40;
  double local_b30;
  double local_b20;
  double local_b18;
  double local_b10;
  double local_b08;
  double local_af8;
  double local_af0;
  double local_ae8;
  double local_ae0;
  double local_ad8;
  double local_ad0;
  bool local_ac1;
  double local_ac0;
  double local_ab8;
  double local_ab0;
  double local_aa8;
  double local_aa0;
  double local_a98;
  bool local_a89;
  
  pdVar1 = (double *)in_RDI[0x2f];
  dVar4 = *in_RDX - in_RDX[1];
  __x = *in_RDX + in_RDX[1];
  dVar5 = dVar4 * (1.0 / __x);
  dVar6 = dVar5 + 1.0;
  dVar7 = (double)(dVar6 <= (double)in_RDI[0x31]);
  local_a89 = *in_RDX <= (double)in_RDI[0x30] || dVar7 != 0.0;
  dVar8 = (double)local_a89;
  dVar9 = cbrt(0.3183098861837907);
  dVar10 = dVar9 * 2.519842099789747 * 1.2599210498948732;
  dVar11 = (double)(2.0 <= (double)in_RDI[0x31]);
  local_b20 = cbrt((double)in_RDI[0x31]);
  local_b48 = local_b20 * (double)in_RDI[0x31];
  local_a98 = local_b48;
  if ((dVar11 == 0.0) && (!NAN(dVar11))) {
    local_a98 = 2.5198420997897464;
  }
  dVar12 = cbrt(__x);
  dVar13 = cbrt(1.0 / dVar6);
  dVar14 = cbrt(9.0);
  dVar14 = dVar14 * dVar14 * dVar9 * dVar9 * (double)in_RDI[4] * 1.4422495703074083;
  dVar15 = (1.0 / dVar12) * 1.2599210498948732;
  local_aa0 = local_b20;
  if ((dVar11 == 0.0) && (!NAN(dVar11))) {
    local_aa0 = 1.2599210498948732;
  }
  local_ab0 = (dVar14 * dVar15 * dVar13 * (1.0 / local_aa0)) / 18.0;
  bVar2 = 1.35 <= local_ab0;
  dVar11 = (double)(1.35 < local_ab0);
  local_aa8 = local_ab0;
  if ((dVar11 == 0.0) && (!NAN(dVar11))) {
    local_aa8 = 1.35;
  }
  local_aa8 = local_aa8 * local_aa8;
  dVar16 = local_aa8 * local_aa8;
  dVar17 = dVar16 * dVar16;
  if ((dVar11 != 0.0) || (NAN(dVar11))) {
    local_ab0 = 1.35;
  }
  dVar11 = sqrt(3.141592653589793);
  dVar18 = erf((1.0 / local_ab0) / 2.0);
  dVar19 = exp(-(1.0 / (local_ab0 * local_ab0)) / 4.0);
  if (((double)bVar2 != 0.0) || (NAN((double)bVar2))) {
    local_ab8 = (((((((1.0 / local_aa8) / 36.0 - (1.0 / dVar16) / 960.0) +
                    (1.0 / (dVar16 * local_aa8)) / 26880.0) - (1.0 / dVar17) / 829440.0) +
                  ((1.0 / dVar17) / local_aa8) / 28385280.0) -
                 ((1.0 / dVar17) / dVar16) / 1073479680.0) +
                ((1.0 / dVar17) / (dVar16 * local_aa8)) / 44590694400.0) -
                (1.0 / (dVar17 * dVar17)) / 2021444812800.0;
  }
  else {
    local_ab8 = -(local_ab0 * 2.6666666666666665) *
                (local_ab0 * 2.0 *
                 (-(local_ab0 * local_ab0 * 2.0) * (dVar19 - 1.0) + (dVar19 - 1.5)) +
                dVar11 * dVar18) + 1.0;
  }
  dVar16 = *pdVar1;
  dVar17 = pdVar1[1];
  dVar18 = *in_RCX;
  dVar20 = *in_RDX * *in_RDX;
  dVar21 = cbrt(*in_RDX);
  dVar22 = (1.0 / (dVar21 * dVar21)) / dVar20;
  dVar23 = *in_RCX * dVar22;
  dVar19 = pdVar1[2];
  dVar24 = cbrt(9.869604401089358);
  dVar24 = dVar24 * dVar24 * 3.3019272488946267;
  dVar25 = dVar24 * 0.3;
  dVar21 = *in_R9 * ((1.0 / (dVar21 * dVar21)) / *in_RDX);
  dVar26 = dVar25 - dVar21;
  dVar27 = dVar25 + dVar21;
  if ((dVar8 != 0.0) || (NAN(dVar8))) {
    local_ac0 = 0.0;
  }
  else {
    local_ac0 = dVar6 * 1.4422495703074083 * dVar10 * -0.046875 *
                local_a98 * dVar12 *
                (1.0 / dVar13) * local_ab8 *
                (dVar19 * dVar26 * (1.0 / dVar27) +
                dVar17 * dVar18 * 0.003840616724010807 * dVar22 *
                (1.0 / (dVar23 * 0.003840616724010807 + 1.0)) + dVar16);
  }
  dVar5 = 1.0 - dVar5;
  dVar13 = (double)(dVar5 <= (double)in_RDI[0x31]);
  local_ac1 = in_RDX[1] <= (double)in_RDI[0x30] || dVar13 != 0.0;
  dVar18 = (double)local_ac1;
  dVar28 = cbrt(1.0 / dVar5);
  local_ad8 = (dVar14 * dVar15 * dVar28 * (1.0 / local_aa0)) / 18.0;
  bVar2 = 1.35 <= local_ad8;
  dVar14 = (double)(1.35 < local_ad8);
  local_ad0 = local_ad8;
  if ((dVar14 == 0.0) && (!NAN(dVar14))) {
    local_ad0 = 1.35;
  }
  local_ad0 = local_ad0 * local_ad0;
  dVar29 = local_ad0 * local_ad0;
  dVar30 = dVar29 * dVar29;
  if ((dVar14 != 0.0) || (NAN(dVar14))) {
    local_ad8 = 1.35;
  }
  dVar14 = erf((1.0 / local_ad8) / 2.0);
  dVar31 = exp(-(1.0 / (local_ad8 * local_ad8)) / 4.0);
  if (((double)bVar2 != 0.0) || (NAN((double)bVar2))) {
    local_ae0 = (((((((1.0 / local_ad0) / 36.0 - (1.0 / dVar29) / 960.0) +
                    (1.0 / (dVar29 * local_ad0)) / 26880.0) - (1.0 / dVar30) / 829440.0) +
                  ((1.0 / dVar30) / local_ad0) / 28385280.0) -
                 ((1.0 / dVar30) / dVar29) / 1073479680.0) +
                ((1.0 / dVar30) / (dVar29 * local_ad0)) / 44590694400.0) -
                (1.0 / (dVar30 * dVar30)) / 2021444812800.0;
  }
  else {
    local_ae0 = -(local_ad8 * 2.6666666666666665) *
                (local_ad8 * 2.0 *
                 (-(local_ad8 * local_ad8 * 2.0) * (dVar31 - 1.0) + (dVar31 - 1.5)) +
                dVar11 * dVar14) + 1.0;
  }
  dVar11 = in_RCX[2];
  dVar14 = in_RDX[1] * in_RDX[1];
  dVar29 = cbrt(in_RDX[1]);
  dVar30 = (1.0 / (dVar29 * dVar29)) / dVar14;
  dVar31 = in_RCX[2] * dVar30;
  dVar32 = in_R9[1] * ((1.0 / (dVar29 * dVar29)) / in_RDX[1]);
  dVar29 = dVar25 - dVar32;
  dVar25 = dVar25 + dVar32;
  if ((dVar18 != 0.0) || (NAN(dVar18))) {
    local_ae8 = 0.0;
  }
  else {
    local_ae8 = dVar5 * 1.4422495703074083 * dVar10 * -0.046875 *
                local_a98 * dVar12 *
                (1.0 / dVar28) * local_ae0 *
                (dVar19 * dVar29 * (1.0 / dVar25) +
                dVar17 * dVar11 * 0.003840616724010807 * dVar30 *
                (1.0 / (dVar31 * 0.003840616724010807 + 1.0)) + dVar16);
  }
  if ((dVar7 != 0.0) || (local_af0 = dVar6, NAN(dVar7))) {
    local_af0 = (double)in_RDI[0x31];
  }
  dVar10 = dVar9 * 1.4422495703074083 * 2.519842099789747;
  local_b20 = 1.0 / local_b20;
  dVar11 = cbrt(dVar6);
  local_af8 = local_b20;
  if ((dVar7 == 0.0) && (!NAN(dVar7))) {
    local_af8 = 1.0 / dVar11;
  }
  dVar16 = dVar10 * dVar15 * local_af8;
  dVar17 = sqrt(dVar16);
  dVar19 = sqrt(dVar16);
  dVar19 = dVar16 * dVar19;
  dVar28 = dVar9 * dVar9 * 2.080083823051904;
  dVar33 = dVar28 * 1.5874010519681996;
  dVar34 = 1.0 / (dVar12 * dVar12);
  dVar35 = dVar34 * 1.5874010519681996;
  dVar36 = dVar33 * dVar35 * local_af8 * local_af8;
  dVar37 = log(16.081979498692537 /
               (dVar36 * 0.123235 + dVar19 * 0.204775 + dVar17 * 3.79785 + dVar16 * 0.8969) + 1.0);
  dVar37 = (dVar16 * 0.053425 + 1.0) * 0.0621814 * dVar37;
  local_b08 = local_b48;
  if ((double)in_RDI[0x31] < 0.0) {
    local_b08 = 0.0;
  }
  dVar38 = ((local_a98 + local_b08) - 2.0) * 1.9236610509315362;
  dVar39 = log(32.16395899738507 /
               (dVar36 * 0.1562925 + dVar19 * 0.420775 + dVar17 * 7.05945 + dVar16 * 1.549425) + 1.0
              );
  dVar17 = log(29.608749977793437 /
               (dVar36 * 0.1241775 + dVar19 * 0.1100325 + dVar17 * 5.1785 + dVar16 * 0.905775) + 1.0
              );
  dVar17 = (dVar16 * 0.0278125 + 1.0) * dVar17;
  if ((dVar8 != 0.0) || (NAN(dVar8))) {
    local_b10 = 0.0;
  }
  else {
    local_b10 = (local_af0 *
                (dVar38 * 0.0197516734986138 * dVar17 +
                dVar38 * (dVar17 * -0.0197516734986138 +
                         (dVar16 * 0.05137 + 1.0) * -0.0310907 * dVar39 + dVar37) + -dVar37)) / 2.0;
  }
  dVar8 = pdVar1[3];
  dVar16 = *in_RCX;
  dVar37 = dVar23 * 0.46914023462026644 + 1.0;
  dVar17 = pdVar1[4];
  dVar19 = pdVar1[5];
  dVar39 = dVar26 * dVar26;
  dVar40 = dVar27 * dVar27;
  dVar36 = pdVar1[6];
  dVar41 = *in_RCX * *in_RCX;
  dVar41 = dVar41 * dVar41 * dVar41;
  dVar20 = dVar20 * dVar20 * dVar20 * dVar20;
  dVar42 = 1.0 / (dVar20 * dVar20);
  dVar43 = dVar37 * dVar37;
  dVar43 = (1.0 / (dVar43 * dVar43)) / dVar43;
  dVar20 = pdVar1[7];
  if ((dVar13 != 0.0) || (local_b18 = dVar5, NAN(dVar13))) {
    local_b18 = (double)in_RDI[0x31];
  }
  dVar44 = cbrt(dVar5);
  if ((dVar13 == 0.0) && (!NAN(dVar13))) {
    local_b20 = 1.0 / dVar44;
  }
  dVar10 = dVar10 * dVar15 * local_b20;
  dVar15 = sqrt(dVar10);
  dVar45 = sqrt(dVar10);
  dVar45 = dVar10 * dVar45;
  dVar33 = dVar33 * dVar35 * local_b20 * local_b20;
  dVar35 = log(16.081979498692537 /
               (dVar33 * 0.123235 + dVar45 * 0.204775 + dVar15 * 3.79785 + dVar10 * 0.8969) + 1.0);
  dVar35 = (dVar10 * 0.053425 + 1.0) * 0.0621814 * dVar35;
  dVar46 = log(32.16395899738507 /
               (dVar33 * 0.1562925 + dVar45 * 0.420775 + dVar15 * 7.05945 + dVar10 * 1.549425) + 1.0
              );
  dVar15 = log(29.608749977793437 /
               (dVar33 * 0.1241775 + dVar45 * 0.1100325 + dVar15 * 5.1785 + dVar10 * 0.905775) + 1.0
              );
  dVar15 = (dVar10 * 0.0278125 + 1.0) * dVar15;
  if ((dVar18 != 0.0) || (NAN(dVar18))) {
    local_b30 = 0.0;
  }
  else {
    local_b30 = (local_b18 *
                (dVar38 * 0.0197516734986138 * dVar15 +
                dVar38 * (dVar15 * -0.0197516734986138 +
                         (dVar10 * 0.05137 + 1.0) * -0.0310907 * dVar46 + dVar35) + -dVar35)) / 2.0;
  }
  dVar10 = in_RCX[2];
  dVar15 = dVar31 * 0.46914023462026644 + 1.0;
  dVar18 = dVar29 * dVar29;
  dVar33 = dVar25 * dVar25;
  dVar35 = in_RCX[2] * in_RCX[2];
  dVar35 = dVar35 * dVar35 * dVar35;
  dVar14 = dVar14 * dVar14 * dVar14 * dVar14;
  dVar14 = 1.0 / (dVar14 * dVar14);
  dVar38 = dVar15 * dVar15;
  dVar38 = (1.0 / (dVar38 * dVar38)) / dVar38;
  dVar9 = dVar9 * 1.4422495703074083 * 2.519842099789747 * (1.0 / dVar12);
  dVar12 = sqrt(dVar9);
  dVar45 = sqrt(dVar9);
  dVar45 = dVar9 * dVar45;
  dVar34 = dVar28 * 1.5874010519681996 * dVar34;
  dVar28 = log(16.081979498692537 /
               (dVar34 * 0.123235 + dVar45 * 0.204775 + dVar12 * 3.79785 + dVar9 * 0.8969) + 1.0);
  dVar28 = (dVar9 * 0.053425 + 1.0) * 0.0621814 * dVar28;
  local_b40 = local_b48;
  if ((dVar7 == 0.0) && (!NAN(dVar7))) {
    local_b40 = dVar11 * dVar6;
  }
  if ((dVar13 == 0.0) && (!NAN(dVar13))) {
    local_b48 = dVar44 * dVar5;
  }
  dVar5 = ((local_b40 + local_b48) - 2.0) * 1.9236610509315362;
  dVar13 = log(32.16395899738507 /
               (dVar34 * 0.1562925 + dVar45 * 0.420775 + dVar12 * 7.05945 + dVar9 * 1.549425) + 1.0)
  ;
  dVar12 = log(29.608749977793437 /
               (dVar34 * 0.1241775 + dVar45 * 0.1100325 + dVar12 * 5.1785 + dVar9 * 0.905775) + 1.0)
  ;
  dVar12 = (dVar9 * 0.0278125 + 1.0) * dVar12;
  dVar6 = pdVar1[9];
  dVar24 = dVar24 * 0.3 * (dVar21 + dVar32);
  dVar32 = dVar21 * 2.0 * dVar32;
  dVar21 = dVar24 - dVar32;
  dVar21 = dVar21 * dVar21;
  dVar24 = dVar24 + dVar32;
  dVar24 = dVar24 * dVar24;
  dVar7 = pdVar1[10];
  dVar32 = dVar21 * dVar21 * dVar21;
  dVar34 = (1.0 / (dVar24 * dVar24)) / dVar24;
  dVar11 = pdVar1[0xb];
  dVar23 = sqrt(dVar23 + dVar31);
  dVar23 = cbrt(dVar23 * 1.4142135623730951);
  if ((*in_stack_00000008 != 0) && ((*(uint *)(*in_RDI + 0x40) & 1) != 0)) {
    lVar3 = in_RSI * (int)in_RDI[0xb];
    *(double *)(*in_stack_00000008 + lVar3 * 8) =
         local_ac0 + local_ae8 +
         local_b10 *
         (dVar20 * dVar39 * dVar39 * (1.0 / (dVar40 * dVar40)) * 0.010661445329398458 * dVar41 *
          dVar42 * dVar43 +
         dVar36 * dVar41 * 0.010661445329398458 * dVar42 * dVar43 +
         dVar19 * dVar39 * (1.0 / dVar40) +
         dVar8 * dVar16 * 0.46914023462026644 * dVar22 * (1.0 / dVar37) +
         dVar17 * dVar26 * (1.0 / dVar27)) +
         local_b30 *
         (dVar20 * dVar18 * dVar18 * (1.0 / (dVar33 * dVar33)) * 0.010661445329398458 * dVar35 *
          dVar14 * dVar38 +
         dVar36 * dVar35 * 0.010661445329398458 * dVar14 * dVar38 +
         dVar19 * dVar18 * (1.0 / dVar33) +
         dVar8 * dVar10 * 0.46914023462026644 * dVar30 * (1.0 / dVar15) +
         dVar17 * dVar29 * (1.0 / dVar25)) +
         (((dVar5 * 0.0197516734986138 * dVar12 +
           dVar4 * dVar4 * dVar4 * dVar4 * (1.0 / (__x * __x * __x * __x)) *
           dVar5 * (dVar12 * -0.0197516734986138 +
                   (dVar9 * 0.05137 + 1.0) * -0.0310907 * dVar13 + dVar28) + -dVar28) - local_b10) -
         local_b30) *
         (dVar7 * dVar32 * dVar34 + dVar6 * dVar21 * (1.0 / dVar24) + pdVar1[8] +
          (dVar11 * dVar32 * dVar34 * 1.2599210498948732 * dVar23 * dVar23) / 2.0 +
         (pdVar1[0xc] * dVar21 * (1.0 / dVar24) * 1.2599210498948732 * dVar23 * dVar23) / 2.0) +
         *(double *)(*in_stack_00000008 + lVar3 * 8);
  }
  return;
}

Assistant:

GPU_DEVICE_FUNCTION static inline void
func_exc_pol(const xc_func_type *p, size_t ip, const double *rho, const double *sigma, const double *lapl, const double *tau, xc_mgga_out_params *out)
{
  double t2, t3, t4, t6, t7, t8, t11, t12;
  double t15, t16, t17, t18, t19, t20, t21, t22;
  double t23, t24, t26, t27, t28, t29, t30, t31;
  double t32, t33, t34, t35, t37, t38, t39, t41;
  double t42, t43, t44, t45, t46, t48, t49, t50;
  double t51, t52, t54, t55, t56, t57, t58, t60;
  double t61, t62, t63, t64, t66, t68, t70, t72;
  double t73, t74, t76, t77, t79, t80, t82, t83;
  double t85, t86, t87, t89, t92, t93, t94, t97;
  double t98, t99, t101, t102, t104, t105, t107, t108;
  double t109, t110, t111, t113, t114, t115, t116, t119;
  double t120, t121, t123, t124, t126, t127, t128, t129;
  double t130, t131, t132, t133, t136, t137, t138, t140;
  double t141, t143, t144, t146, t147, t149, t151, t152;
  double t154, t156, t157, t158, t159, t160, t163, t164;
  double t166, t167, t168, t170, t171, t173, t174, t176;
  double t177, t178, t181, t182, t183, t185, t186, t188;
  double t189, t190, t193, t194, t195, t197, t198, t200;
  double t201, t203, t204, t205, t207, t208, t209, t211;
  double t212, t214, t215, t216, t219, t220, t221, t223;
  double t224, t226, t227, t228, t230, t234, t235, t236;
  double t238, t239, t240, t241, t243, t244, t245, t246;
  double t248, t249, t250, t251, t252, t253, t255, t256;
  double t257, t258, t260, t261, t262, t263, t265, t266;
  double t267, t268, t271, t273, t275, t277, t279, t281;
  double t283, t284, t285, t287, t290, t291, t292, t295;
  double t297, t299, t301, t302, t303, t304, t305, t307;
  double t308, t309, t310, t313, t315, t317, t318, t319;
  double t320, t321, t322, t323, t324, t327, t329, t331;
  double t333, t335, t336, t337, t338, t339, t342, t343;
  double t345, t347, t349, t351, t352, t353, t356, t358;
  double t360, t361, t362, t365, t367, t369, t371, t372;
  double t373, t375, t377, t379, t380, t381, t384, t386;
  double t388, t389, t390, t392, t396, tzk0;

  mgga_x_mn12_params *params;

  assert(p->params != NULL);
  params = (mgga_x_mn12_params * ) (p->params);

  t2 = rho[0] <= p->dens_threshold;
  t3 = M_CBRT3;
  t4 = M_CBRTPI;
  t6 = t3 / t4;
  t7 = rho[0] + rho[1];
  t8 = 0.1e1 / t7;
  t11 = 0.2e1 * rho[0] * t8 <= p->zeta_threshold;
  t12 = p->zeta_threshold - 0.1e1;
  t15 = 0.2e1 * rho[1] * t8 <= p->zeta_threshold;
  t16 = -t12;
  t17 = rho[0] - rho[1];
  t18 = t17 * t8;
  t19 = my_piecewise5(t11, t12, t15, t16, t18);
  t20 = 0.1e1 + t19;
  t21 = t20 <= p->zeta_threshold;
  t22 = POW_1_3(p->zeta_threshold);
  t23 = t22 * p->zeta_threshold;
  t24 = POW_1_3(t20);
  t26 = my_piecewise3(t21, t23, t24 * t20);
  t27 = POW_1_3(t7);
  t28 = t26 * t27;
  t29 = params->c[0];
  t30 = params->c[1];
  t31 = M_CBRT6;
  t32 = t31 * t31;
  t33 = M_PI * M_PI;
  t34 = POW_1_3(t33);
  t35 = t34 * t34;
  t37 = 0.3e1 / 0.1e2 * t32 * t35;
  t38 = POW_1_3(rho[0]);
  t39 = t38 * t38;
  t41 = 0.1e1 / t39 / rho[0];
  t42 = tau[0] * t41;
  t43 = t37 - t42;
  t44 = t30 * t43;
  t45 = t37 + t42;
  t46 = 0.1e1 / t45;
  t48 = params->c[2];
  t49 = t43 * t43;
  t50 = t48 * t49;
  t51 = t45 * t45;
  t52 = 0.1e1 / t51;
  t54 = params->c[3];
  t55 = t49 * t43;
  t56 = t54 * t55;
  t57 = t51 * t45;
  t58 = 0.1e1 / t57;
  t60 = params->c[4];
  t61 = t49 * t49;
  t62 = t60 * t61;
  t63 = t51 * t51;
  t64 = 0.1e1 / t63;
  t66 = params->c[5];
  t68 = t66 * t61 * t43;
  t70 = 0.1e1 / t63 / t45;
  t72 = params->c[6];
  t73 = params->c[7];
  t74 = t73 * t43;
  t76 = params->c[8];
  t77 = t76 * t49;
  t79 = params->c[9];
  t80 = t79 * t55;
  t82 = params->c[10];
  t83 = t82 * t61;
  t85 = t46 * t74 + t52 * t77 + t58 * t80 + t64 * t83 + t72;
  t86 = t85 * sigma[0];
  t87 = rho[0] * rho[0];
  t89 = 0.1e1 / t39 / t87;
  t92 = 0.1e1 + 0.4e-2 * sigma[0] * t89;
  t93 = 0.1e1 / t92;
  t94 = t89 * t93;
  t97 = params->c[11];
  t98 = params->c[12];
  t99 = t98 * t43;
  t101 = params->c[13];
  t102 = t101 * t49;
  t104 = params->c[14];
  t105 = t104 * t55;
  t107 = t102 * t52 + t105 * t58 + t99 * t46 + t97;
  t108 = sigma[0] * sigma[0];
  t109 = t107 * t108;
  t110 = t87 * t87;
  t111 = t110 * rho[0];
  t113 = 0.1e1 / t38 / t111;
  t114 = t92 * t92;
  t115 = 0.1e1 / t114;
  t116 = t113 * t115;
  t119 = params->c[15];
  t120 = params->c[16];
  t121 = t120 * t43;
  t123 = params->c[17];
  t124 = t123 * t49;
  t126 = t121 * t46 + t124 * t52 + t119;
  t127 = t108 * sigma[0];
  t128 = t126 * t127;
  t129 = t110 * t110;
  t130 = 0.1e1 / t129;
  t131 = t114 * t92;
  t132 = 0.1e1 / t131;
  t133 = t130 * t132;
  t136 = params->c[18];
  t137 = params->c[19];
  t138 = t137 * t43;
  t140 = params->c[20];
  t141 = t140 * t49;
  t143 = params->c[21];
  t144 = t143 * t55;
  t146 = params->c[22];
  t147 = t146 * t61;
  t149 = t138 * t46 + t141 * t52 + t144 * t58 + t147 * t64 + t136;
  t151 = M_CBRT2;
  t152 = 0.1e1 / t27 * t151;
  t154 = 0.1e1 + t18 <= p->zeta_threshold;
  t156 = 0.1e1 - t18 <= p->zeta_threshold;
  t157 = my_piecewise5(t154, t12, t156, t16, t18);
  t158 = 0.1e1 + t157;
  t159 = 0.1e1 / t158;
  t160 = POW_1_3(t159);
  t163 = 0.1e1 + 0.39999999999999999998e0 * t152 * t160;
  t164 = 0.1e1 / t163;
  t166 = params->c[23];
  t167 = params->c[24];
  t168 = t167 * t43;
  t170 = params->c[25];
  t171 = t170 * t49;
  t173 = params->c[26];
  t174 = t173 * t55;
  t176 = t168 * t46 + t171 * t52 + t174 * t58 + t166;
  t177 = t176 * sigma[0];
  t178 = t94 * t164;
  t181 = params->c[27];
  t182 = params->c[28];
  t183 = t182 * t43;
  t185 = params->c[29];
  t186 = t185 * t49;
  t188 = t183 * t46 + t186 * t52 + t181;
  t189 = t188 * t108;
  t190 = t116 * t164;
  t193 = params->c[30];
  t194 = params->c[31];
  t195 = t194 * t43;
  t197 = params->c[32];
  t198 = t197 * t49;
  t200 = params->c[33];
  t201 = t200 * t55;
  t203 = t195 * t46 + t198 * t52 + t201 * t58 + t193;
  t204 = t163 * t163;
  t205 = 0.1e1 / t204;
  t207 = params->c[34];
  t208 = params->c[35];
  t209 = t208 * t43;
  t211 = params->c[36];
  t212 = t211 * t49;
  t214 = t209 * t46 + t212 * t52 + t207;
  t215 = t214 * sigma[0];
  t216 = t94 * t205;
  t219 = params->c[37];
  t220 = params->c[38];
  t221 = t220 * t43;
  t223 = params->c[39];
  t224 = t223 * t49;
  t226 = t221 * t46 + t224 * t52 + t219;
  t227 = t204 * t163;
  t228 = 0.1e1 / t227;
  t230 = t29 + t44 * t46 + t50 * t52 + t56 * t58 + t62 * t64 + t68 * t70 + 0.4e-2 * t86 * t94 + 0.16e-4 * t109 * t116 + 0.64e-7 * t128 * t133 + t149 * t164 + 0.4e-2 * t177 * t178 + 0.16e-4 * t189 * t190 + t203 * t205 + 0.4e-2 * t215 * t216 + t226 * t228;
  t234 = my_piecewise3(t2, 0, -0.3e1 / 0.8e1 * t6 * t28 * t230);
  t235 = rho[1] <= p->dens_threshold;
  t236 = -t17;
  t238 = my_piecewise5(t15, t12, t11, t16, t236 * t8);
  t239 = 0.1e1 + t238;
  t240 = t239 <= p->zeta_threshold;
  t241 = POW_1_3(t239);
  t243 = my_piecewise3(t240, t23, t241 * t239);
  t244 = t243 * t27;
  t245 = POW_1_3(rho[1]);
  t246 = t245 * t245;
  t248 = 0.1e1 / t246 / rho[1];
  t249 = tau[1] * t248;
  t250 = t37 - t249;
  t251 = t30 * t250;
  t252 = t37 + t249;
  t253 = 0.1e1 / t252;
  t255 = t250 * t250;
  t256 = t48 * t255;
  t257 = t252 * t252;
  t258 = 0.1e1 / t257;
  t260 = t255 * t250;
  t261 = t54 * t260;
  t262 = t257 * t252;
  t263 = 0.1e1 / t262;
  t265 = t255 * t255;
  t266 = t60 * t265;
  t267 = t257 * t257;
  t268 = 0.1e1 / t267;
  t271 = t66 * t265 * t250;
  t273 = 0.1e1 / t267 / t252;
  t275 = t73 * t250;
  t277 = t76 * t255;
  t279 = t79 * t260;
  t281 = t82 * t265;
  t283 = t253 * t275 + t258 * t277 + t263 * t279 + t268 * t281 + t72;
  t284 = t283 * sigma[2];
  t285 = rho[1] * rho[1];
  t287 = 0.1e1 / t246 / t285;
  t290 = 0.1e1 + 0.4e-2 * sigma[2] * t287;
  t291 = 0.1e1 / t290;
  t292 = t287 * t291;
  t295 = t98 * t250;
  t297 = t101 * t255;
  t299 = t104 * t260;
  t301 = t253 * t295 + t258 * t297 + t263 * t299 + t97;
  t302 = sigma[2] * sigma[2];
  t303 = t301 * t302;
  t304 = t285 * t285;
  t305 = t304 * rho[1];
  t307 = 0.1e1 / t245 / t305;
  t308 = t290 * t290;
  t309 = 0.1e1 / t308;
  t310 = t307 * t309;
  t313 = t120 * t250;
  t315 = t123 * t255;
  t317 = t253 * t313 + t258 * t315 + t119;
  t318 = t302 * sigma[2];
  t319 = t317 * t318;
  t320 = t304 * t304;
  t321 = 0.1e1 / t320;
  t322 = t308 * t290;
  t323 = 0.1e1 / t322;
  t324 = t321 * t323;
  t327 = t137 * t250;
  t329 = t140 * t255;
  t331 = t143 * t260;
  t333 = t146 * t265;
  t335 = t253 * t327 + t258 * t329 + t263 * t331 + t268 * t333 + t136;
  t336 = my_piecewise5(t156, t12, t154, t16, -t18);
  t337 = 0.1e1 + t336;
  t338 = 0.1e1 / t337;
  t339 = POW_1_3(t338);
  t342 = 0.1e1 + 0.39999999999999999998e0 * t152 * t339;
  t343 = 0.1e1 / t342;
  t345 = t167 * t250;
  t347 = t170 * t255;
  t349 = t173 * t260;
  t351 = t253 * t345 + t258 * t347 + t263 * t349 + t166;
  t352 = t351 * sigma[2];
  t353 = t292 * t343;
  t356 = t182 * t250;
  t358 = t185 * t255;
  t360 = t253 * t356 + t258 * t358 + t181;
  t361 = t360 * t302;
  t362 = t310 * t343;
  t365 = t194 * t250;
  t367 = t197 * t255;
  t369 = t200 * t260;
  t371 = t253 * t365 + t258 * t367 + t263 * t369 + t193;
  t372 = t342 * t342;
  t373 = 0.1e1 / t372;
  t375 = t208 * t250;
  t377 = t211 * t255;
  t379 = t253 * t375 + t258 * t377 + t207;
  t380 = t379 * sigma[2];
  t381 = t292 * t373;
  t384 = t220 * t250;
  t386 = t223 * t255;
  t388 = t253 * t384 + t258 * t386 + t219;
  t389 = t372 * t342;
  t390 = 0.1e1 / t389;
  t392 = t29 + t251 * t253 + t256 * t258 + t261 * t263 + t266 * t268 + t271 * t273 + 0.4e-2 * t284 * t292 + 0.16e-4 * t303 * t310 + 0.64e-7 * t319 * t324 + t335 * t343 + 0.4e-2 * t352 * t353 + 0.16e-4 * t361 * t362 + t371 * t373 + 0.4e-2 * t380 * t381 + t388 * t390;
  t396 = my_piecewise3(t235, 0, -0.3e1 / 0.8e1 * t6 * t244 * t392);
  tzk0 = t234 + t396;

  if(out->zk != NULL && (p->info->flags & XC_FLAGS_HAVE_EXC))
    out->zk[ip*p->dim.zk + 0] += tzk0;

}